

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_safecopyLiterals(BYTE *op,BYTE *ip,BYTE *iend,BYTE *ilimit_w)

{
  long lVar1;
  BYTE *dst;
  BYTE *src;
  BYTE *ilimit_w_local;
  BYTE *iend_local;
  BYTE *ip_local;
  BYTE *op_local;
  BYTE *oend;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  if (iend <= ilimit_w) {
    __assert_fail("iend > ilimit_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x201c,
                  "void ZSTD_safecopyLiterals(BYTE *, const BYTE *, const BYTE *const, const BYTE *)"
                 );
  }
  iend_local = ip;
  ip_local = op;
  if (ip <= ilimit_w) {
    lVar1 = (long)op - (long)ip;
    if (lVar1 < 8 && -0x10 < lVar1) {
      __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1268,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    if (lVar1 < 0x10 && -0x10 < lVar1) {
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1270,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    ZSTD_copy16(op,ip);
    src = ip + 0x10;
    for (dst = op + 0x10; dst < op + ((long)ilimit_w - (long)ip); dst = dst + 0x20) {
      ZSTD_copy16(dst,src);
      ZSTD_copy16(dst + 0x10,src + 0x10);
      src = src + 0x20;
    }
    ip_local = op + ((long)ilimit_w - (long)ip);
    iend_local = ilimit_w;
  }
  while (iend_local < iend) {
    *ip_local = *iend_local;
    iend_local = iend_local + 1;
    ip_local = ip_local + 1;
  }
  return;
}

Assistant:

static void ZSTD_safecopyLiterals(BYTE* op, BYTE const* ip, BYTE const* const iend, BYTE const* ilimit_w) {
    assert(iend > ilimit_w);
    if (ip <= ilimit_w) {
        ZSTD_wildcopy(op, ip, ilimit_w - ip, ZSTD_no_overlap);
        op += ilimit_w - ip;
        ip = ilimit_w;
    }
    while (ip < iend) *op++ = *ip++;
}